

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O0

void __thiscall
iDynTree::SpatialInertia::fromRotationalInertiaWrtCenterOfMass
          (SpatialInertia *this,double mass,Position *com,RotationalInertia *rotInertiaWrtCom)

{
  double dVar1;
  Stride<0,_0> *this_00;
  double *dataPtr;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *this_01;
  MatrixFixSize<3U,_3U> *in_RDX;
  VectorFixSize<3U> *in_RSI;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  Vector3d *in_stack_00000038;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> mcom;
  Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> comInertia;
  Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> linkInertia;
  int i;
  EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffea8;
  PointerArgType in_stack_fffffffffffffeb8;
  Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_fffffffffffffec0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffef8;
  int local_24;
  
  *(double *)in_RDI = in_XMM0_Qa;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    dVar1 = *(double *)in_RDI;
    dVar2 = VectorFixSize<3U>::operator()(in_RSI,(long)local_24);
    *(double *)(in_RDI + (long)local_24 * 8 + 8) = dVar1 * dVar2;
  }
  this_00 = (Stride<0,_0> *)MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)(in_RDI + 0x20));
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,this_00);
  dataPtr = MatrixFixSize<3U,_3U>::data(in_RDX);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffec0,dataPtr,this_00);
  this_01 = in_RDI + 8;
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,
             dataPtr,this_00);
  if (ABS(*(double *)in_RDI) <= 0.0) {
    Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this_00,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffea8);
  }
  else {
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,in_stack_fffffffffffffea8);
    squareCrossProductMatrix(in_stack_00000038);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator/
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>::
    operator-(in_stack_fffffffffffffed8,in_RDI);
    Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this_00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
                *)in_stack_fffffffffffffea8);
  }
  return;
}

Assistant:

void SpatialInertia::fromRotationalInertiaWrtCenterOfMass(const double mass,
                                                        const Position& com,
                                                        const RotationalInertia& rotInertiaWrtCom)
{
    this->m_mass = mass;

    for(int i = 0; i < 3; i++ )
    {
        this->m_mcom[i] = this->m_mass*com(i);
    }

    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<const Eigen::Matrix3d> comInertia(rotInertiaWrtCom.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0)
    {
        linkInertia = comInertia - squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        linkInertia = comInertia;
    }
}